

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

string * __thiscall cmdline::parser::error_abi_cxx11_(string *__return_storage_ptr__,parser *this)

{
  size_type sVar1;
  const_reference pvVar2;
  allocator local_19;
  parser *local_18;
  parser *this_local;
  
  local_18 = this;
  this_local = (parser *)__return_storage_ptr__;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->errors);
  if (sVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,anon_var_dwarf_469e1 + 0xb79,&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->errors,0);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string error() const{
    return errors.size()>0?errors[0]:"";
  }